

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O0

vector<long,_std::allocator<long>_> *
phmap::priv::GenerateValuesWithSeed<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,size_t n,int maxval,int seed)

{
  const_reference pvVar1;
  long local_60;
  size_type local_58;
  size_t i;
  Generator<long> local_3c;
  undefined1 local_38 [4];
  Generator<long> gen;
  vector<int,_std::allocator<int>_> nums;
  int seed_local;
  int maxval_local;
  size_t n_local;
  vector<long,_std::allocator<long>_> *vec;
  
  GenerateNumbersWithSeed((vector<int,_std::allocator<int>_> *)local_38,n,maxval,seed);
  Generator<long>::Generator(&local_3c,maxval);
  i._3_1_ = 0;
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  std::vector<long,_std::allocator<long>_>::reserve(__return_storage_ptr__,n);
  for (local_58 = 0; local_58 < n; local_58 = local_58 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,local_58);
    local_60 = Generator<long>::operator()(&local_3c,*pvVar1);
    std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&local_60);
  }
  i._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }